

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synapse.cpp
# Opt level: O0

void __thiscall indk::Neuron::Synapse::Synapse(Synapse *this)

{
  Position *this_00;
  Synapse *this_local;
  
  std::vector<float,_std::allocator<float>_>::vector(&this->GammaQ);
  this_00 = (Position *)operator_new(0x10);
  Position::Position(this_00);
  this->SPos = this_00;
  this->ok1 = 0.0;
  this->ok2 = 0.0;
  this->k1 = 0.0;
  this->k2 = 0.0;
  this->Lambda = 0.0;
  this->Tl = 0;
  this->Gamma = 0.0;
  this->dGamma = 0.0;
  this->QCounter = -1;
  std::__atomic_base<long>::operator=(&(this->QSize).super___atomic_base<long>,0);
  return;
}

Assistant:

indk::Neuron::Synapse::Synapse() {
    SPos = new indk::Position();
    ok1 = 0;
    ok2 = 0;
    k1 = 0;
    k2 = 0;
    Lambda = 0;
    Tl = 0;
    Gamma = 0;
    dGamma = 0;
    QCounter = -1;
    QSize = 0;
}